

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

yyjson_mut_val * duckdb_yyjson::yyjson_val_mut_copy(yyjson_mut_doc *m_doc,yyjson_val *i_vals)

{
  yyjson_val_pool *pool;
  yyjson_str_pool *pool_00;
  uint64_t uVar1;
  void *__src;
  byte bVar2;
  bool bVar3;
  yyjson_val *pyVar4;
  yyjson_mut_val *__dest;
  char *pcVar5;
  yyjson_val *pyVar6;
  ulong uVar7;
  yyjson_mut_val *pyVar8;
  yyjson_mut_val *pyVar9;
  
  if (i_vals != (yyjson_val *)0x0 && m_doc != (yyjson_mut_doc *)0x0) {
    if ((~(uint)i_vals->tag & 6) == 0) {
      pcVar5 = (i_vals->uni).str;
    }
    else {
      pcVar5 = (char *)0x10;
    }
    uVar7 = (long)pcVar5 >> 4;
    pool = &m_doc->val_pool;
    pyVar8 = (m_doc->val_pool).cur;
    if ((ulong)(((long)(m_doc->val_pool).end - (long)pyVar8) / 0x18) < uVar7) {
      bVar3 = unsafe_yyjson_val_pool_grow(pool,&m_doc->alc,uVar7);
      if (!bVar3) {
        return (yyjson_mut_val *)0x0;
      }
      pyVar8 = pool->cur;
    }
    pool->cur = pyVar8 + uVar7;
    if (pyVar8 != (yyjson_mut_val *)0x0) {
      pyVar6 = (yyjson_val *)(pcVar5 + (long)i_vals);
      pool_00 = &m_doc->str_pool;
      pyVar9 = pyVar8;
      while( true ) {
        if (pyVar6 <= i_vals) {
          return pyVar8;
        }
        uVar1 = i_vals->tag;
        pyVar9->tag = uVar1;
        __src = (i_vals->uni).ptr;
        (pyVar9->uni).ptr = __src;
        bVar2 = (byte)uVar1;
        if ((bVar2 & 3) == 1) break;
        bVar2 = bVar2 & 7;
        if (bVar2 == 7) {
          if (0xff < i_vals->tag) {
            __dest = pyVar9 + 1;
            pyVar4 = i_vals;
            for (uVar7 = i_vals->tag >> 8; 1 < uVar7; uVar7 = uVar7 - 1) {
              pcVar5 = (char *)0x10;
              if ((~(uint)pyVar4[2].tag & 6) == 0) {
                pcVar5 = pyVar4[2].uni.str;
              }
              pyVar4 = (yyjson_val *)(pcVar5 + (long)&pyVar4[1].tag);
              __dest->next = __dest + 1;
              __dest[1].next = __dest + ((long)(pcVar5 + 0x10) >> 4);
              __dest = __dest + ((long)(pcVar5 + 0x10) >> 4);
            }
            __dest->next = __dest + 1;
            __dest[1].next = pyVar9 + 1;
            goto LAB_01b84572;
          }
        }
        else if ((bVar2 == 6) && (0xff < i_vals->tag)) {
          pyVar4 = i_vals + 1;
          __dest = pyVar9 + 1;
          for (uVar7 = i_vals->tag >> 8; 1 < uVar7; uVar7 = uVar7 - 1) {
            pcVar5 = (char *)0x10;
            if ((~(uint)pyVar4->tag & 6) == 0) {
              pcVar5 = (pyVar4->uni).str;
            }
            pyVar4 = (yyjson_val *)(pcVar5 + (long)&pyVar4->tag);
            __dest->next = __dest + ((long)pcVar5 >> 4);
            __dest = __dest + ((long)pcVar5 >> 4);
          }
          __dest->next = pyVar9 + 1;
LAB_01b84572:
          (pyVar9->uni).ptr = __dest;
        }
        i_vals = i_vals + 1;
        pyVar9 = pyVar9 + 1;
      }
      uVar7 = i_vals->tag >> 8;
      __dest = (yyjson_mut_val *)(m_doc->str_pool).cur;
      if (uVar7 < (ulong)((long)(m_doc->str_pool).end - (long)__dest)) {
LAB_01b84540:
        pool_00->cur = (char *)((long)&__dest->tag + uVar7 + 1);
        if (__dest != (yyjson_mut_val *)0x0) {
          switchD_016b0717::default(__dest,__src,uVar7);
          *(undefined1 *)((long)&__dest->tag + uVar7) = 0;
          goto LAB_01b84572;
        }
      }
      else {
        bVar3 = unsafe_yyjson_str_pool_grow(pool_00,&m_doc->alc,uVar7 + 1);
        if (bVar3) {
          __dest = (yyjson_mut_val *)pool_00->cur;
          goto LAB_01b84540;
        }
      }
      (pyVar9->uni).u64 = 0;
    }
  }
  return (yyjson_mut_val *)0x0;
}

Assistant:

yyjson_mut_val *yyjson_val_mut_copy(yyjson_mut_doc *m_doc,
                                    yyjson_val *i_vals) {
    /*
     The immutable object or array stores all sub-values in a contiguous memory,
     We copy them to another contiguous memory as mutable values,
     then reconnect the mutable values with the original relationship.
     */
    usize i_vals_len;
    yyjson_mut_val *m_vals, *m_val;
    yyjson_val *i_val, *i_end;

    if (!m_doc || !i_vals) return NULL;
    i_end = unsafe_yyjson_get_next(i_vals);
    i_vals_len = (usize)(unsafe_yyjson_get_next(i_vals) - i_vals);
    m_vals = unsafe_yyjson_mut_val(m_doc, i_vals_len);
    if (!m_vals) return NULL;
    i_val = i_vals;
    m_val = m_vals;

    for (; i_val < i_end; i_val++, m_val++) {
        yyjson_type type = unsafe_yyjson_get_type(i_val);
        m_val->tag = i_val->tag;
        m_val->uni.u64 = i_val->uni.u64;
        if (type == YYJSON_TYPE_STR || type == YYJSON_TYPE_RAW) {
            const char *str = i_val->uni.str;
            usize str_len = unsafe_yyjson_get_len(i_val);
            m_val->uni.str = unsafe_yyjson_mut_strncpy(m_doc, str, str_len);
            if (!m_val->uni.str) return NULL;
        } else if (type == YYJSON_TYPE_ARR) {
            usize len = unsafe_yyjson_get_len(i_val);
            if (len > 0) {
                yyjson_val *ii_val = i_val + 1, *ii_next;
                yyjson_mut_val *mm_val = m_val + 1, *mm_ctn = m_val, *mm_next;
                while (len-- > 1) {
                    ii_next = unsafe_yyjson_get_next(ii_val);
                    mm_next = mm_val + (ii_next - ii_val);
                    mm_val->next = mm_next;
                    ii_val = ii_next;
                    mm_val = mm_next;
                }
                mm_val->next = mm_ctn + 1;
                mm_ctn->uni.ptr = mm_val;
            }
        } else if (type == YYJSON_TYPE_OBJ) {
            usize len = unsafe_yyjson_get_len(i_val);
            if (len > 0) {
                yyjson_val *ii_key = i_val + 1, *ii_nextkey;
                yyjson_mut_val *mm_key = m_val + 1, *mm_ctn = m_val;
                yyjson_mut_val *mm_nextkey;
                while (len-- > 1) {
                    ii_nextkey = unsafe_yyjson_get_next(ii_key + 1);
                    mm_nextkey = mm_key + (ii_nextkey - ii_key);
                    mm_key->next = mm_key + 1;
                    mm_key->next->next = mm_nextkey;
                    ii_key = ii_nextkey;
                    mm_key = mm_nextkey;
                }
                mm_key->next = mm_key + 1;
                mm_key->next->next = mm_ctn + 1;
                mm_ctn->uni.ptr = mm_key;
            }
        }
    }

    return m_vals;
}